

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_waitfds(Curl_multi *multi,curl_waitfd *ufds,uint size,uint *fd_count)

{
  CURLcode CVar1;
  CURLMcode CVar2;
  Curl_llist_node *n;
  Curl_easy *data;
  curl_waitfds cwfds;
  curl_waitfds cStack_38;
  
  if (ufds == (curl_waitfd *)0x0) {
    return CURLM_BAD_FUNCTION_ARGUMENT;
  }
  CVar2 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) &&
     (CVar2 = CURLM_RECURSIVE_API_CALL, (multi->field_0x279 & 4) == 0)) {
    Curl_waitfds_init(&cStack_38,ufds,size);
    for (n = Curl_llist_head(&multi->process); n != (Curl_llist_node *)0x0; n = Curl_node_next(n)) {
      data = (Curl_easy *)Curl_node_elem(n);
      multi_getsock(data,&data->last_poll);
      CVar1 = Curl_waitfds_add_ps(&cStack_38,&data->last_poll);
      if (CVar1 != CURLE_OK) {
        CVar2 = CURLM_OUT_OF_MEMORY;
        goto LAB_0014344c;
      }
    }
    CVar1 = Curl_cpool_add_waitfds(&multi->cpool,&cStack_38);
    CVar2 = (uint)(CVar1 != CURLE_OK) * 3;
LAB_0014344c:
    if (fd_count != (uint *)0x0) {
      *fd_count = cStack_38.n;
    }
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_waitfds(struct Curl_multi *multi,
                             struct curl_waitfd *ufds,
                             unsigned int size,
                             unsigned int *fd_count)
{
  struct curl_waitfds cwfds;
  CURLMcode result = CURLM_OK;
  struct Curl_llist_node *e;

  if(!ufds)
    return CURLM_BAD_FUNCTION_ARGUMENT;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  Curl_waitfds_init(&cwfds, ufds, size);
  for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
    struct Curl_easy *data = Curl_node_elem(e);
    multi_getsock(data, &data->last_poll);
    if(Curl_waitfds_add_ps(&cwfds, &data->last_poll)) {
      result = CURLM_OUT_OF_MEMORY;
      goto out;
    }
  }

  if(Curl_cpool_add_waitfds(&multi->cpool, &cwfds)) {
    result = CURLM_OUT_OF_MEMORY;
    goto out;
  }

out:
  if(fd_count)
    *fd_count = cwfds.n;
  return result;
}